

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.cc
# Opt level: O0

vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *
cnn::mp::CreateWorkloads(uint num_children)

{
  reference pvVar1;
  uint in_ESI;
  vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *in_RDI;
  uint cid;
  int err;
  vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *workloads;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_> *in_stack_ffffffffffffffe0;
  allocator_type local_12;
  undefined1 local_11;
  int local_10;
  uint local_c;
  
  local_11 = 0;
  __a = &local_12;
  local_c = in_ESI;
  std::allocator<cnn::mp::Workload>::allocator((allocator<cnn::mp::Workload> *)0x6227e6);
  std::vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>::vector
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
             ,__a);
  std::allocator<cnn::mp::Workload>::~allocator((allocator<cnn::mp::Workload> *)0x622806);
  uVar2 = 0;
  while( true ) {
    if (local_c <= uVar2) {
      return in_RDI;
    }
    pvVar1 = std::vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>::operator[]
                       (in_RDI,(ulong)uVar2);
    local_10 = pipe(pvVar1->p2c);
    if (local_10 != 0) break;
    pvVar1 = std::vector<cnn::mp::Workload,_std::allocator<cnn::mp::Workload>_>::operator[]
                       (in_RDI,(ulong)uVar2);
    local_10 = pipe(pvVar1->c2p);
    if (local_10 != 0) {
      __assert_fail("err == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/mp.cc"
                    ,0x47,"std::vector<Workload> cnn::mp::CreateWorkloads(unsigned int)");
    }
    uVar2 = uVar2 + 1;
    local_10 = 0;
  }
  __assert_fail("err == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/mp.cc"
                ,0x45,"std::vector<Workload> cnn::mp::CreateWorkloads(unsigned int)");
}

Assistant:

std::vector<Workload> CreateWorkloads(unsigned num_children) {
      int err;
      std::vector<Workload> workloads(num_children);
      for (unsigned cid = 0; cid < num_children; cid++) { 
        err = pipe(workloads[cid].p2c);
        assert (err == 0);
        err = pipe(workloads[cid].c2p);
        assert (err == 0);
      }
      return workloads;
    }